

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O3

Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readSequence_abi_cxx11_
          (Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  pointer *ppVVar1;
  _Alloc_hider _Var2;
  pointer pVVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  pointer pVVar6;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  YamlEvent event;
  Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Sequence seq;
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  bool local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pointer local_90;
  _Alloc_hider _Stack_88;
  undefined1 local_80 [48];
  bool local_50;
  vector<yaml::Value,_std::allocator<yaml::Value>_> local_48;
  
  local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar6 = (pointer)(local_e8 + 8);
LAB_00148a9d:
  while (getNextEvent_abi_cxx11_
                   ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_f8,this), local_d0 != false) {
    local_c8._0_4_ = local_f8._0_4_;
    local_c8._8_8_ = local_b8 + 8;
    if ((pointer)local_f8._8_8_ == pVVar6) {
      uStack_a8 = local_e8._16_4_;
      uStack_a4 = local_e8._20_4_;
    }
    else {
      local_c8._8_8_ = local_f8._8_8_;
    }
    local_b8._12_4_ = local_e8._12_4_;
    local_b8._8_4_ = local_e8._8_4_;
    local_b8._0_8_ = local_e8._0_8_;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_4_ = local_e8._8_4_ & 0xffffff00;
    local_f8._8_8_ = pVVar6;
    switch(local_f8._0_4_) {
    case 6:
      std::vector<yaml::Value,std::allocator<yaml::Value>>::emplace_back<std::__cxx11::string>
                ((vector<yaml::Value,std::allocator<yaml::Value>> *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 8)
                );
      break;
    case 7:
      readSequence_abi_cxx11_
                ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80,this);
      if (local_80[0x20] == '\0') {
        local_a0._M_allocated_capacity = (size_type)(pointer)&local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_80._0_8_,(pointer)(local_80._8_8_ + local_80._0_8_));
        ppVVar1 = &(__return_storage_ptr__->field_0).value_.
                   super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppVVar1;
        if ((pointer)local_a0._M_allocated_capacity == (pointer)&local_90) {
          *ppVVar1 = local_90;
          *(pointer *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               _Stack_88._M_p;
        }
        else {
          (__return_storage_ptr__->field_0).value_.
          super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_a0._M_allocated_capacity;
          (__return_storage_ptr__->field_0).value_.
          super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_90;
        }
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
        __return_storage_ptr__->has_value_ = false;
        Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_80);
        goto LAB_00148e4c;
      }
      std::vector<yaml::Value,std::allocator<yaml::Value>>::
      emplace_back<std::vector<yaml::Value,std::allocator<yaml::Value>>>
                ((vector<yaml::Value,std::allocator<yaml::Value>> *)&local_48,
                 (vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_80);
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
      break;
    case 8:
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->has_value_ = true;
      goto LAB_00148e4c;
    case 9:
      readMapping_abi_cxx11_
                ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80,this);
      if (local_50 == false) {
        local_a0._M_allocated_capacity = (size_type)(pointer)&local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_80._0_8_,(pointer)(local_80._8_8_ + local_80._0_8_));
        ppVVar1 = &(__return_storage_ptr__->field_0).value_.
                   super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppVVar1;
        if ((pointer)local_a0._M_allocated_capacity == (pointer)&local_90) {
          *ppVVar1 = local_90;
          *(pointer *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               _Stack_88._M_p;
        }
        else {
          (__return_storage_ptr__->field_0).value_.
          super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_a0._M_allocated_capacity;
          (__return_storage_ptr__->field_0).value_.
          super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_90;
        }
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
        __return_storage_ptr__->has_value_ = false;
        Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_80);
        goto LAB_00148e4c;
      }
      std::vector<yaml::Value,_std::allocator<yaml::Value>_>::emplace_back<yaml::Mapping>
                (&local_48,(Mapping *)local_80);
      Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
      break;
    default:
      format_abi_cxx11_((string *)&local_a0,"Unexpected event %d");
      if ((pointer)local_a0._M_allocated_capacity == (pointer)&local_90) {
        local_80._24_8_ = _Stack_88._M_p;
        uVar5 = (pointer)(local_80 + 0x10);
      }
      else {
        local_80._0_8_ = local_a0._M_allocated_capacity;
        uVar5 = local_a0._M_allocated_capacity;
      }
      local_80._16_8_ = local_90;
      ppVVar1 = &(__return_storage_ptr__->field_0).value_.
                 super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppVVar1;
      if ((pointer)uVar5 == (pointer)(local_80 + 0x10)) {
        *ppVVar1 = local_90;
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
             local_80._24_8_;
      }
      else {
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)uVar5;
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_90;
      }
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_a0._8_8_;
      __return_storage_ptr__->has_value_ = false;
LAB_00148e4c:
      if ((pointer)local_c8._8_8_ != (pointer)(local_b8 + 8)) {
        operator_delete((void *)local_c8._8_8_,(ulong)(local_b8._8_8_ + 1));
      }
      if (local_d0 != true) goto LAB_00148c6a;
      goto LAB_00148e73;
    }
    if ((pointer)local_c8._8_8_ != (pointer)(local_b8 + 8)) {
      operator_delete((void *)local_c8._8_8_,(ulong)(local_b8._8_8_ + 1));
    }
    if (local_d0 != true) goto LAB_00148bb8;
    pVVar3 = pVVar6;
    _Var4._M_p = (pointer)local_f8._8_8_;
    if ((pointer)local_f8._8_8_ != pVVar6) goto LAB_00148bce;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 "Error while reading sequence: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  _Var4._M_p._4_4_ = local_c8._4_4_;
  _Var4._M_p._0_4_ = local_c8._0_4_;
  _Var2._M_p = _Var4._M_p;
  if ((pointer)_Var4._M_p == (pointer)local_b8) {
    local_80._24_8_ = local_b8._8_8_;
    _Var4._M_p = (pointer)(local_80 + 0x10);
    _Var2._M_p = (pointer)local_80._0_8_;
  }
  local_80._0_8_ = _Var2._M_p;
  local_80._16_8_ = local_b8._0_8_;
  ppVVar1 = &(__return_storage_ptr__->field_0).value_.
             super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->field_0).value_.
  super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppVVar1;
  if ((pointer)_Var4._M_p == (pointer)(local_80 + 0x10)) {
    *ppVVar1 = (pointer)local_b8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
         local_80._24_8_;
  }
  else {
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)_Var4._M_p;
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_b8._0_8_;
  }
  (__return_storage_ptr__->field_0).value_.
  super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_c8._8_8_;
  __return_storage_ptr__->has_value_ = false;
  if ((local_d0 & 1U) == 0) {
LAB_00148c6a:
    _Var4._M_p = (pointer)CONCAT44(local_f8._4_4_,local_f8._0_4_);
    pVVar6 = (pointer)(local_f8 + 0x10);
    if ((pointer)_Var4._M_p == pVVar6) goto LAB_00148c88;
  }
  else {
LAB_00148e73:
    _Var4._M_p = (pointer)local_f8._8_8_;
    if ((pointer)local_f8._8_8_ == pVVar6) goto LAB_00148c88;
  }
  operator_delete(_Var4._M_p,*(long *)pVVar6 + 1);
LAB_00148c88:
  std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&local_48);
  return __return_storage_ptr__;
LAB_00148bb8:
  _Var4._M_p = (pointer)CONCAT44(local_f8._4_4_,local_f8._0_4_);
  pVVar3 = (pointer)(local_f8 + 0x10);
  if ((pointer)_Var4._M_p != pVVar3) {
LAB_00148bce:
    operator_delete(_Var4._M_p,*(long *)pVVar3 + 1);
  }
  goto LAB_00148a9d;
}

Assistant:

Expected<Sequence, std::string> readSequence() {
		Sequence seq;
		for (;;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading sequence: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_SCALAR_EVENT:
					MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
					seq.emplace_back(std::move(event.value));
					break;
				case YAML_SEQUENCE_START_EVENT:
					MSG("YAML_SEQUENCE_START_EVENT");
					{
						auto result = readSequence();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_MAPPING_START_EVENT:
					MSG("YAML_MAPPING_START_EVENT");
					{
						auto result = readMapping();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_SEQUENCE_END_EVENT:
					MSG("YAML_SEQUENCE_END_EVENT");
					return seq;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			}
		}
	}